

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

Vec_Int_t * Acb_ObjMarkTfo(Acb_Ntk_t *p,Vec_Int_t *vDivs,int Pivot,int nTfoLevMax,int nFanMax)

{
  int iObj;
  Vec_Int_t *p_00;
  int i;
  
  p_00 = Vec_IntAlloc(1000);
  Acb_NtkIncTravId(p);
  Acb_ObjSetTravIdCur(p,Pivot);
  Vec_IntPush(p_00,Pivot);
  for (i = 0; i < vDivs->nSize; i = i + 1) {
    iObj = Vec_IntEntry(vDivs,i);
    Acb_ObjMarkTfo_rec(p,iObj,nTfoLevMax,nFanMax,p_00);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_ObjMarkTfo( Acb_Ntk_t * p, Vec_Int_t * vDivs, int Pivot, int nTfoLevMax, int nFanMax )
{
    Vec_Int_t * vMarked = Vec_IntAlloc( 1000 );
    int i, iObj;
    Acb_NtkIncTravId( p );
    Acb_ObjSetTravIdCur( p, Pivot );
    Vec_IntPush( vMarked, Pivot );
    Vec_IntForEachEntry( vDivs, iObj, i )
        Acb_ObjMarkTfo_rec( p, iObj, nTfoLevMax, nFanMax, vMarked );
    return vMarked;
}